

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O3

CutoffGroup * __thiscall
OpenMD::MoleculeCreator::createCutoffGroup
          (MoleculeCreator *this,Molecule *param_1,Atom *atom,LocalIndexManager *localIndexMan)

{
  int iVar1;
  CutoffGroup *this_00;
  
  this_00 = (CutoffGroup *)operator_new(0x40);
  (this_00->cutoffAtomList).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->cutoffAtomList).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->cutoffAtomList).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->globalIndex = -1;
  this_00->localIndex_ = -1;
  this_00->snapshotMan_ = (SnapshotManager *)0x0;
  this_00->storage_ = 0x380;
  this_00->haveTotalMass = false;
  this_00->totalMass = 0.0;
  CutoffGroup::addAtom(this_00,atom);
  iVar1 = IndexListContainer::pop(&localIndexMan->cutoffGroupIndexContainer_);
  this_00->localIndex_ = iVar1;
  return this_00;
}

Assistant:

CutoffGroup* MoleculeCreator::createCutoffGroup(
      Molecule*, Atom* atom, LocalIndexManager* localIndexMan) {
    CutoffGroup* cg;
    cg = new CutoffGroup();
    cg->addAtom(atom);

    // set the local index of this cutoffGroup, global index will be set later
    cg->setLocalIndex(localIndexMan->getNextCutoffGroupIndex());

    return cg;
  }